

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O1

vf_status_t vf_validate(vf_profile_t profile)

{
  int iVar1;
  
  iVar1 = (uint)(profile.bias < (ulong)~(-1L << ((byte)profile.exp_bits & 0x3f))) * 2 + -2;
  if (profile.bias == 0) {
    iVar1 = -2;
  }
  if ((uint)profile.bits <= profile.exp_bits + 2) {
    iVar1 = -2;
  }
  if (profile.exp_bits == 0) {
    iVar1 = -2;
  }
  if (0x3f < (ushort)(profile.bits - 1)) {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

vf_status_t vf_validate(const vf_profile_t profile) {
	const int bases_valid = (sizeof(vf_base_t) * CHAR_BIT) == (sizeof(vf_float_base_t) * CHAR_BIT);
	const int bits_valid = (profile.bits > 0) && (profile.bits <= sizeof(vf_base_t) * CHAR_BIT);
	const int exponent_valid = (profile.exp_bits > 0) && (1 + profile.exp_bits + 1 < profile.bits);
	const int bias_valid = (profile.bias > 0) && (profile.bias < ((vf_base_t) 1 << profile.exp_bits) - 1);
	return (bases_valid && bits_valid && exponent_valid && bias_valid) ? VF_STATUS_OK : VF_STATUS_INVALID_PROFILE;
}